

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbitarray.cpp
# Opt level: O1

QBitArray * __thiscall
QBitArray::inverted_inplace(QBitArray *__return_storage_ptr__,QBitArray *this)

{
  byte bVar1;
  byte *pbVar2;
  ulong capacity;
  byte *pbVar3;
  int iVar4;
  QArrayData *pQVar5;
  ulong uVar6;
  char *__old_val;
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayData *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pbVar2 = (byte *)(this->d).d.ptr;
  capacity = (this->d).d.size;
  (__return_storage_ptr__->d).d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  pQVar5 = &((this->d).d.d)->super_QArrayData;
  if (pQVar5 == (QArrayData *)0x0) {
    if (capacity == 0) goto LAB_0035bb66;
  }
  else if ((capacity == 0) ||
          ((((QArrayData *)&pQVar5->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 1)) {
LAB_0035bb66:
    (this->d).d.d = (Data *)0x0;
    (this->d).d.ptr = (char *)0x0;
    (this->d).d.size = 0;
    pbVar3 = pbVar2;
    goto LAB_0035bb77;
  }
  local_30 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  pbVar3 = (byte *)QArrayData::allocate1(&local_30,capacity,KeepSize);
  pQVar5 = local_30;
LAB_0035bb77:
  (__return_storage_ptr__->d).d.d = (Data *)pQVar5;
  (__return_storage_ptr__->d).d.ptr = (char *)pbVar3;
  (__return_storage_ptr__->d).d.size = capacity;
  if (capacity == 0) {
    iVar4 = 8;
  }
  else {
    bVar1 = *pbVar2;
    *pbVar3 = bVar1;
    iVar4 = 0x10 - (uint)bVar1;
  }
  if (1 < capacity) {
    uVar6 = 1;
    do {
      pbVar3[uVar6] = ~pbVar2[uVar6];
      uVar6 = uVar6 + 1;
    } while (capacity != uVar6);
  }
  if (iVar4 != 8) {
    pbVar3[capacity - 1] = pbVar3[capacity - 1] & ~(byte)(-1 << ((byte)iVar4 & 0x1f));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE QBitArray QBitArray::inverted_inplace() &&
{
    qsizetype n = d.size();
    uchar *dst = reinterpret_cast<uchar *>(data_ptr().data());
    const uchar *src = dst;
    QBitArray result([&] {
        if (d.isDetached() || n == 0)
            return std::move(d.data_ptr());     // invert in-place

        QByteArrayData tmp(n, n);
        dst = reinterpret_cast<uchar *>(tmp.data());
        return tmp;
    }());

    uchar bitdiff = 8;
    if (n)
        bitdiff = dst[0] = src[0];      // copy the count of bits in the last byte

    for (qsizetype i = 1; i < n; ++i)
        dst[i] = ~src[i];

    if (int tailCount = 16 - bitdiff; tailCount != 8) {
        // zero the bits beyond our size in the last byte
        Q_ASSERT(n > 1);
        uchar tailMask = (1U << tailCount) - 1;
        dst[n - 1] &= tailMask;
    }

    return result;
}